

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

void extent_destroy_wrapper
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  extent_deregister(tsdn,extent);
  *(ushort *)&extent->e_addr = *(ushort *)&extent->e_addr & 0xf000;
  extent_hooks_assure_initialized(arena,r_extent_hooks);
  if (*r_extent_hooks == &extent_hooks_default) {
    extent_destroy_default_impl
              ((void *)((ulong)extent->e_addr & 0xfffffffffffff000),
               (extent->field_2).e_size_esn & 0xfffffffffffff000);
  }
  else if ((*r_extent_hooks)->destroy != (extent_destroy_t *)0x0) {
    extent_hook_pre_reentrancy(tsdn,arena);
    (*(*r_extent_hooks)->destroy)
              (*r_extent_hooks,(void *)((ulong)extent->e_addr & 0xfffffffffffff000),
               (extent->field_2).e_size_esn & 0xfffffffffffff000,
               (_Bool)((byte)((uint)extent->e_bits >> 0xd) & 1),arena->base->ind);
    extent_hook_post_reentrancy(tsdn);
  }
  extent_dalloc(tsdn,arena,extent);
  return;
}

Assistant:

void
extent_destroy_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	assert(extent_base_get(extent) != NULL);
	assert(extent_size_get(extent) != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Deregister first to avoid a race with other allocating threads. */
	extent_deregister(tsdn, extent);

	extent_addr_set(extent, extent_base_get(extent));

	extent_hooks_assure_initialized(arena, r_extent_hooks);
	/* Try to destroy; silently fail otherwise. */
	if (*r_extent_hooks == &extent_hooks_default) {
		/* Call directly to propagate tsdn. */
		extent_destroy_default_impl(extent_base_get(extent),
		    extent_size_get(extent));
	} else if ((*r_extent_hooks)->destroy != NULL) {
		extent_hook_pre_reentrancy(tsdn, arena);
		(*r_extent_hooks)->destroy(*r_extent_hooks,
		    extent_base_get(extent), extent_size_get(extent),
		    extent_committed_get(extent), arena_ind_get(arena));
		extent_hook_post_reentrancy(tsdn);
	}

	extent_dalloc(tsdn, arena, extent);
}